

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

void __thiscall rapic::scan::initialize_rays(scan *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  header *phVar4;
  string *psVar5;
  undefined8 uVar6;
  runtime_error *prVar7;
  char *in_RDI;
  double dVar8;
  vector<rapic::ray_header,_std::allocator<rapic::ray_header>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  double dVar9;
  char *in_stack_00000008;
  scan *in_stack_00000010;
  int inc;
  double endrng;
  double startrng;
  double rngres;
  header *p_1;
  header *p;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar10;
  
  lVar3 = get_header_integer(in_stack_00000010,in_stack_00000008);
  *(int *)(in_RDI + 0x50) = (int)lVar3;
  phVar4 = find_header((scan *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI)
  ;
  if (phVar4 != (header *)0x0) {
    lVar3 = header::get_integer((header *)0x11324a);
    *(int *)(in_RDI + 0x54) = (int)lVar3;
  }
  psVar5 = get_header_string_abi_cxx11_(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x58),(string *)psVar5);
  phVar4 = find_header((scan *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI)
  ;
  if (phVar4 != (header *)0x0) {
    header::value_abi_cxx11_(phVar4);
    uVar6 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar6,"%d of %d",in_RDI + 0x78,in_RDI + 0x7c);
    if (iVar2 != 2) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"invalid PASS header");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  get_header_string_abi_cxx11_(in_stack_00000010,in_stack_00000008);
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  in_RDI[0x80] = bVar1;
  dVar8 = get_header_real(in_stack_00000010,in_stack_00000008);
  *(float *)(in_RDI + 0x8c) = (float)dVar8;
  this_00 = (vector<rapic::ray_header,_std::allocator<rapic::ray_header>_> *)
            get_header_real(in_stack_00000010,in_stack_00000008);
  dVar8 = get_header_real(in_stack_00000010,in_stack_00000008);
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            get_header_real(in_stack_00000010,in_stack_00000008);
  iVar10 = 1;
  uVar6 = std::__cxx11::string::c_str();
  iVar2 = __isoc99_sscanf(uVar6,"%*s %*s SECTOR ANGLE1=%f ANGLE2=%f ANGLEINCREASING=%d",
                          in_RDI + 0x84,in_RDI + 0x88,&stack0xffffffffffffffbc);
  if (iVar2 == 3) {
    if (iVar10 == 0) {
      std::swap<float>((float *)(in_RDI + 0x84),(float *)(in_RDI + 0x88));
    }
    while (*(float *)(in_RDI + 0x88) <= *(float *)(in_RDI + 0x84)) {
      *(float *)(in_RDI + 0x88) = *(float *)(in_RDI + 0x88) + 360.0;
    }
  }
  else {
    in_RDI[0x84] = '\0';
    in_RDI[0x85] = '\0';
    in_RDI[0x86] = '\0';
    in_RDI[0x87] = '\0';
    in_RDI[0x88] = '\0';
    in_RDI[0x89] = '\0';
    in_RDI[0x8a] = -0x4c;
    in_RDI[0x8b] = 'C';
  }
  lVar3 = std::lround((double)(ulong)(uint)((*(float *)(in_RDI + 0x88) - *(float *)(in_RDI + 0x84))
                                           / *(float *)(in_RDI + 0x8c)));
  *(int *)(in_RDI + 0x30) = (int)lVar3;
  dVar9 = remainder((double)(*(float *)(in_RDI + 0x88) - *(float *)(in_RDI + 0x84)),
                    (double)*(float *)(in_RDI + 0x8c));
  if (dVar9 <= 0.001) {
    lVar3 = lround(((double)this_01 - dVar8) / (double)this_00);
    *(int *)(in_RDI + 0x34) = (int)lVar3;
    if ((-1 < *(int *)(in_RDI + 0x34)) &&
       (dVar9 = remainder((double)this_01 - dVar8,(double)this_00), dVar9 <= 0.001)) {
      std::vector<rapic::ray_header,_std::allocator<rapic::ray_header>_>::reserve
                (this_00,(size_type)dVar8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this_01,CONCAT44(iVar10,in_stack_ffffffffffffffb8));
      return;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"RNGRES is not a factor of range span");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"ANGRES is not a factor of sweep length");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto scan::initialize_rays() -> void
{
  // if this is our first ray, setup the data array

  // store the header fields which we cache
  station_id_ = get_header_integer("STNID");
  if (auto p = find_header("VOLUMEID"))
    volume_id_ = p->get_integer();
  product_ = get_header_string("PRODUCT");
  if (auto p = find_header("PASS"))
  {
    if (sscanf(p->value().c_str(), "%d of %d", &pass_, &pass_count_) != 2)
      throw std::runtime_error{"invalid PASS header"};
  }
  is_rhi_ = get_header_string("IMGFMT") == "RHI";

  // get the mandatory characteristics needed to determine scan structure
  angle_resolution_ = get_header_real("ANGRES");
  double rngres = get_header_real("RNGRES");
  double startrng = get_header_real("STARTRNG");
  double endrng = get_header_real("ENDRNG");

  // if start/end angles are provided, use them to limit our ray count
  int inc = 1;
  if (sscanf(product_.c_str(), "%*s %*s SECTOR ANGLE1=%f ANGLE2=%f ANGLEINCREASING=%d", &angle_min_, &angle_max_, &inc) == 3)
  {
    if (inc == 0)
      std::swap(angle_min_, angle_max_);
    while (angle_max_ <= angle_min_)
      angle_max_ += 360.0;
  }
  else
  {
    angle_min_ = 0.0f;
    angle_max_ = 360.0f;
  }

  rays_ = std::lround((angle_max_ - angle_min_) / angle_resolution_);
  if (remainder(angle_max_ - angle_min_, angle_resolution_) > 0.001)
    throw std::runtime_error{"ANGRES is not a factor of sweep length"};

  bins_ = std::lround((endrng - startrng) / rngres);
  if (bins_ < 0 || remainder(endrng - startrng, rngres) > 0.001)
    throw std::runtime_error("RNGRES is not a factor of range span");

  ray_headers_.reserve(rays_);
  level_data_.resize(rays_ * bins_);
}